

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

bool __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasis(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  long lVar1;
  bool bVar2;
  type_conflict5 tVar3;
  SPxStatus SVar4;
  int iVar5;
  Status SVar6;
  int iVar7;
  Section SVar8;
  ostream *this_00;
  Status *pSVar9;
  ulong *puVar10;
  char *pcVar11;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RCX;
  long in_RDX;
  istream *in_RSI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  int r;
  int c;
  MPSInput mps;
  int i_2;
  int i_1;
  Desc l_desc;
  DataKey key_1;
  int i;
  stringstream name_1;
  int nRows;
  DataKey key;
  int j;
  stringstream name;
  int nCols;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  NameSet *cNames;
  NameSet *rNames;
  undefined4 in_stack_fffffffffffff638;
  int in_stack_fffffffffffff63c;
  byte bVar12;
  Type in_stack_fffffffffffff640;
  Type in_stack_fffffffffffff644;
  Status in_stack_fffffffffffff648;
  Type in_stack_fffffffffffff64c;
  Type in_stack_fffffffffffff650;
  Status in_stack_fffffffffffff654;
  Desc *in_stack_fffffffffffff658;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  Real in_stack_fffffffffffff668;
  undefined4 in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff674;
  undefined1 in_stack_fffffffffffff675;
  undefined1 in_stack_fffffffffffff676;
  undefined1 in_stack_fffffffffffff677;
  undefined8 in_stack_fffffffffffff678;
  undefined7 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff687;
  undefined6 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff696;
  type_conflict5 tVar13;
  undefined1 in_stack_fffffffffffff697;
  DataKey *in_stack_fffffffffffff698;
  undefined7 in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6a7;
  DataKey in_stack_fffffffffffff6d8;
  ostream *in_stack_fffffffffffff700;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff708;
  int local_8e8;
  int in_stack_fffffffffffff764;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff768;
  ulong local_580;
  undefined1 local_578 [80];
  undefined1 local_528 [80];
  ulong local_4d8;
  undefined1 local_4d0 [80];
  int local_480;
  int local_47c;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  local_478;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  local_460;
  string local_438 [32];
  DataKey local_418;
  DataKey local_410;
  int local_404;
  stringstream local_400 [16];
  ostream local_3f0 [380];
  int local_274;
  string local_270 [32];
  DataKey local_250;
  DataKey local_248;
  int local_240;
  stringstream local_230 [16];
  ostream local_220 [380];
  int local_a4;
  long local_a0;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_90;
  long local_88;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_80;
  long local_78;
  istream *local_70;
  undefined8 local_60;
  ulong *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  undefined8 local_30;
  ulong *local_28;
  undefined1 *local_20;
  ulong *local_18;
  undefined8 local_10;
  ulong *local_8;
  
  local_98 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)0x0;
  local_a0 = 0;
  local_90 = in_RCX;
  local_88 = in_RDX;
  local_80 = in_RCX;
  local_78 = in_RDX;
  local_70 = in_RSI;
  if (in_RCX == (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    local_a4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x4e7bcf);
    std::__cxx11::stringstream::stringstream(local_230);
    spx_alloc<soplex::NameSet*>
              ((NameSet **)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (int)((ulong)in_stack_fffffffffffff678 >> 0x20));
    NameSet::NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
                     (int)((ulong)in_stack_fffffffffffff678 >> 0x20),(int)in_stack_fffffffffffff678,
                     (Real)CONCAT17(in_stack_fffffffffffff677,
                                    CONCAT16(in_stack_fffffffffffff676,
                                             CONCAT15(in_stack_fffffffffffff675,
                                                      CONCAT14(in_stack_fffffffffffff674,
                                                               in_stack_fffffffffffff670)))),
                     in_stack_fffffffffffff668);
    in_stack_fffffffffffff708 = local_98;
    NameSet::reMax((NameSet *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                   in_stack_fffffffffffff63c);
    for (local_240 = 0; local_240 < local_a4; local_240 = local_240 + 1) {
      in_stack_fffffffffffff700 = std::operator<<(local_220,"x");
      std::ostream::operator<<(in_stack_fffffffffffff700,local_240);
      local_250 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ::colId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                                   0);
      local_248 = local_250;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add((NameSet *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0),
                   in_stack_fffffffffffff698,
                   (char *)CONCAT17(in_stack_fffffffffffff697,
                                    CONCAT16(in_stack_fffffffffffff696,in_stack_fffffffffffff690)));
      std::__cxx11::string::~string(local_270);
    }
    local_90 = local_98;
    std::__cxx11::stringstream::~stringstream(local_230);
  }
  if (local_88 == 0) {
    local_274 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x4e7dd9);
    std::__cxx11::stringstream::stringstream(local_400);
    spx_alloc<soplex::NameSet*>
              ((NameSet **)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
               (int)((ulong)in_stack_fffffffffffff678 >> 0x20));
    lVar1 = local_a0;
    NameSet::NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
                     (int)((ulong)in_stack_fffffffffffff678 >> 0x20),(int)in_stack_fffffffffffff678,
                     (Real)CONCAT17(in_stack_fffffffffffff677,
                                    CONCAT16(in_stack_fffffffffffff676,
                                             CONCAT15(in_stack_fffffffffffff675,
                                                      CONCAT14(in_stack_fffffffffffff674,
                                                               in_stack_fffffffffffff670)))),
                     in_stack_fffffffffffff668);
    local_a0 = lVar1;
    NameSet::reMax((NameSet *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                   in_stack_fffffffffffff63c);
    for (local_404 = 0; local_404 < local_274; local_404 = local_404 + 1) {
      this_00 = std::operator<<(local_3f0,"C");
      std::ostream::operator<<(this_00,local_404);
      in_stack_fffffffffffff6d8 =
           (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::rowId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),0);
      local_418 = in_stack_fffffffffffff6d8;
      local_410 = in_stack_fffffffffffff6d8;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add((NameSet *)CONCAT17(in_stack_fffffffffffff6a7,in_stack_fffffffffffff6a0),
                   in_stack_fffffffffffff698,
                   (char *)CONCAT17(in_stack_fffffffffffff697,
                                    CONCAT16(in_stack_fffffffffffff696,in_stack_fffffffffffff690)));
      std::__cxx11::string::~string(local_438);
    }
    local_88 = local_a0;
    std::__cxx11::stringstream::~stringstream(local_400);
  }
  SVar4 = status(in_RDI);
  if (SVar4 == NO_PROBLEM) {
    (*in_RDI->_vptr_SPxBasisBase[7])(in_RDI,in_RDI->theLP,0);
  }
  Desc::Desc((Desc *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660),
             in_stack_fffffffffffff658);
  for (local_47c = 0; iVar7 = local_47c,
      iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4e802f), iVar7 < iVar5; local_47c = local_47c + 1) {
    SVar6 = dualRowStatus(in_stack_fffffffffffff768,in_stack_fffffffffffff764);
    pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
             ::operator[](&local_478,local_47c);
    *pSVar9 = SVar6;
  }
  for (local_480 = 0; iVar7 = local_480,
      iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4e80dd), iVar7 < iVar5; local_480 = local_480 + 1) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
            in_stack_fffffffffffff63c);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
            in_stack_fffffffffffff63c);
    bVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x4e8149);
    if (bVar2) {
      pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
               ::operator[](&local_460,local_480);
      *pSVar9 = P_FIXED;
    }
    else {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
              in_stack_fffffffffffff63c);
      puVar10 = (ulong *)infinity();
      local_4d8 = *puVar10 ^ 0x8000000000000000;
      local_50 = local_4d0;
      local_58 = &local_4d8;
      local_60 = 0;
      local_8 = local_58;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                 (double)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                 (type *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
      tVar3 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4e8227);
      tVar13 = false;
      if (tVar3) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                in_stack_fffffffffffff63c);
        local_40 = infinity();
        local_38 = local_528;
        local_48 = 0;
        local_10 = local_40;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                   (double)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                   (type *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
        tVar13 = boost::multiprecision::operator>=
                           ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)0x4e82cc);
      }
      if (tVar13 == false) {
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
                in_stack_fffffffffffff63c);
        puVar10 = (ulong *)infinity();
        local_580 = *puVar10 ^ 0x8000000000000000;
        local_20 = local_578;
        local_28 = &local_580;
        local_30 = 0;
        local_18 = local_28;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<100U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                   (double)CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                   (type *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
        tVar3 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x4e83b4);
        if (tVar3) {
          pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                   ::operator[](&local_460,local_480);
          *pSVar9 = P_ON_UPPER;
        }
        else {
          pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                   ::operator[](&local_460,local_480);
          *pSVar9 = P_ON_LOWER;
        }
      }
      else {
        pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                 ::operator[](&local_460,local_480);
        *pSVar9 = P_FREE;
      }
    }
  }
  MPSInput::MPSInput((MPSInput *)&stack0xfffffffffffff720,local_70);
  bVar2 = MPSInput::readLine((MPSInput *)in_stack_fffffffffffff6d8);
  if ((bVar2) &&
     (pcVar11 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff720), pcVar11 != (char *)0x0)) {
    pcVar11 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff720);
    iVar7 = strcmp(pcVar11,"NAME");
    if (iVar7 == 0) {
      while (bVar2 = MPSInput::readLine((MPSInput *)in_stack_fffffffffffff6d8), bVar2) {
        local_8e8 = -1;
        pcVar11 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff720);
        if (pcVar11 != (char *)0x0) {
          pcVar11 = MPSInput::field0((MPSInput *)&stack0xfffffffffffff720);
          iVar7 = strcmp(pcVar11,"ENDATA");
          if (iVar7 == 0) {
            MPSInput::setSection((MPSInput *)&stack0xfffffffffffff720,ENDATA);
            break;
          }
        }
        pcVar11 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff720);
        if ((pcVar11 == (char *)0x0) ||
           (pcVar11 = MPSInput::field2((MPSInput *)&stack0xfffffffffffff720), pcVar11 == (char *)0x0
           )) break;
        MPSInput::field2((MPSInput *)&stack0xfffffffffffff720);
        iVar7 = NameSet::number((NameSet *)
                                CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                                (char *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640
                                                ));
        if (iVar7 < 0) break;
        pcVar11 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff720);
        if (*pcVar11 == 'X') {
          pcVar11 = MPSInput::field3((MPSInput *)&stack0xfffffffffffff720);
          if (pcVar11 == (char *)0x0) break;
          MPSInput::field3((MPSInput *)&stack0xfffffffffffff720);
          local_8e8 = NameSet::number((NameSet *)
                                      CONCAT44(in_stack_fffffffffffff64c,in_stack_fffffffffffff648),
                                      (char *)CONCAT44(in_stack_fffffffffffff644,
                                                       in_stack_fffffffffffff640));
          if (local_8e8 < 0) break;
        }
        pcVar11 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff720);
        iVar5 = strcmp(pcVar11,"XU");
        if (iVar5 == 0) {
          in_stack_fffffffffffff654 =
               dualColStatus(in_stack_fffffffffffff768,in_stack_fffffffffffff764);
          pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                   ::operator[](&local_460,iVar7);
          *pSVar9 = in_stack_fffffffffffff654;
          in_stack_fffffffffffff650 =
               LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::type(in_stack_fffffffffffff708,(int)((ulong)in_stack_fffffffffffff700 >> 0x20));
          if (in_stack_fffffffffffff650 == GREATER_EQUAL) {
            pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                     ::operator[](&local_478,local_8e8);
            *pSVar9 = P_ON_LOWER;
          }
          else {
            in_stack_fffffffffffff64c =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::type(in_stack_fffffffffffff708,(int)((ulong)in_stack_fffffffffffff700 >> 0x20));
            if (in_stack_fffffffffffff64c == EQUAL) {
              pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                       ::operator[](&local_478,local_8e8);
              *pSVar9 = P_FIXED;
            }
            else {
              pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                       ::operator[](&local_478,local_8e8);
              *pSVar9 = P_ON_UPPER;
            }
          }
        }
        else {
          pcVar11 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff720);
          iVar5 = strcmp(pcVar11,"XL");
          if (iVar5 == 0) {
            in_stack_fffffffffffff648 =
                 dualColStatus(in_stack_fffffffffffff768,in_stack_fffffffffffff764);
            pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                     ::operator[](&local_460,iVar7);
            *pSVar9 = in_stack_fffffffffffff648;
            in_stack_fffffffffffff644 =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::type(in_stack_fffffffffffff708,(int)((ulong)in_stack_fffffffffffff700 >> 0x20));
            if (in_stack_fffffffffffff644 == LESS_EQUAL) {
              pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                       ::operator[](&local_478,local_8e8);
              *pSVar9 = P_ON_UPPER;
            }
            else {
              in_stack_fffffffffffff640 =
                   LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::type(in_stack_fffffffffffff708,(int)((ulong)in_stack_fffffffffffff700 >> 0x20))
              ;
              if (in_stack_fffffffffffff640 == EQUAL) {
                pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                         ::operator[](&local_478,local_8e8);
                *pSVar9 = P_FIXED;
              }
              else {
                pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                         ::operator[](&local_478,local_8e8);
                *pSVar9 = P_ON_LOWER;
              }
            }
          }
          else {
            pcVar11 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff720);
            iVar5 = strcmp(pcVar11,"UL");
            if (iVar5 == 0) {
              pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                       ::operator[](&local_460,iVar7);
              *pSVar9 = P_ON_UPPER;
            }
            else {
              pcVar11 = MPSInput::field1((MPSInput *)&stack0xfffffffffffff720);
              iVar5 = strcmp(pcVar11,"LL");
              if (iVar5 != 0) {
                MPSInput::syntaxError
                          ((MPSInput *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640)
                          );
                break;
              }
              pSVar9 = DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                       ::operator[](&local_460,iVar7);
              *pSVar9 = P_ON_LOWER;
            }
          }
        }
      }
    }
  }
  bVar2 = MPSInput::hasError((MPSInput *)&stack0xfffffffffffff720);
  if (!bVar2) {
    SVar8 = MPSInput::section((MPSInput *)&stack0xfffffffffffff720);
    if (SVar8 == ENDATA) {
      setStatus((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),
                in_stack_fffffffffffff64c);
      (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&local_478);
    }
    else {
      MPSInput::syntaxError
                ((MPSInput *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    }
  }
  if (local_78 == 0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    spx_free<soplex::NameSet*>((NameSet **)0x4e8942);
  }
  if (local_80 ==
      (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
    spx_free<soplex::NameSet*>((NameSet **)0x4e8967);
  }
  bVar2 = MPSInput::hasError((MPSInput *)&stack0xfffffffffffff720);
  bVar12 = bVar2 ^ 0xff;
  MPSInput::~MPSInput((MPSInput *)&stack0xfffffffffffff720);
  Desc::~Desc((Desc *)CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640));
  return (bool)(bVar12 & 1);
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}